

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_formatter.cpp
# Opt level: O2

string * lwlog::details::alignment_formatter::align_left
                   (string *__return_storage_ptr__,string *to_align,uint8_t width,char fill_char)

{
  undefined7 in_register_00000011;
  ulong uVar1;
  
  uVar1 = CONCAT71(in_register_00000011,width) & 0xffffffff;
  if (to_align->_M_string_length < uVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append
              ((ulong)__return_storage_ptr__,(char)uVar1 - (char)to_align->_M_string_length);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)to_align);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string alignment_formatter::align_left(const std::string& to_align, std::uint8_t width, char fill_char)
	{
		if (width <= to_align.size()) return to_align;

		std::string result;
		result.reserve(width);

		result.append(to_align);
		result.append(width - to_align.size(), fill_char);

		return result;
	}